

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

void __thiscall ot::commissioner::coap::Coap::ResponsesCache::Eliminate(ResponsesCache *this)

{
  bool bVar1;
  pointer ppVar2;
  ByteArray *aBytes;
  ResponsesCache **in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  format_args args;
  string_view fmt;
  undefined1 local_1d2 [2];
  ByteArray local_1d0;
  string local_1b8;
  ResponsesCache *local_198;
  anon_class_1_0_00000001 local_18a;
  v10 local_189;
  v10 *local_188;
  char *local_180;
  string local_178;
  allocator local_141;
  string local_140;
  _Base_ptr local_120;
  duration local_118;
  Message *local_110;
  Message *response;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  deadTime;
  iterator earliest;
  time_point now;
  ResponsesCache *this_local;
  undefined1 local_b0 [16];
  v10 *local_a0;
  char *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  string *local_88;
  v10 *local_80;
  v10 *local_78;
  char *pcStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  char *pcStack_40;
  ResponsesCache **local_38;
  undefined1 *local_30;
  ResponsesCache **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  ResponsesCache **local_10;
  
  earliest._M_node = (_Base_ptr)std::chrono::_V2::system_clock::now();
  while( true ) {
    bVar1 = std::
            multimap<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_ot::commissioner::coap::Message,_std::less<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_ot::commissioner::coap::Message>_>_>
            ::empty(&this->mContainer);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    deadTime.__d.__r =
         (duration)
         std::
         multimap<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_ot::commissioner::coap::Message,_std::less<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_ot::commissioner::coap::Message>_>_>
         ::begin(&this->mContainer);
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_ot::commissioner::coap::Message>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_ot::commissioner::coap::Message>_>
                           *)&deadTime);
    response = (Message *)(ppVar2->first).__d.__r;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_ot::commissioner::coap::Message>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_ot::commissioner::coap::Message>_>
                           *)&deadTime);
    local_110 = &ppVar2->second;
    bVar1 = std::chrono::operator>
                      ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&response,
                       (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&earliest);
    if (bVar1) break;
    local_118 = deadTime.__d.__r;
    local_120 = (_Base_ptr)
                std::
                multimap<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,ot::commissioner::coap::Message,std::less<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,ot::commissioner::coap::Message>>>
                ::erase_abi_cxx11_((multimap<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,ot::commissioner::coap::Message,std::less<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,ot::commissioner::coap::Message>>>
                                    *)&this->mContainer,(iterator)deadTime.__d.__r);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_140,"coap",&local_141);
    Eliminate::anon_class_1_0_00000001::operator()(&local_18a);
    local_58 = &local_188;
    local_60 = &local_189;
    bVar3 = ::fmt::v10::operator()(local_60);
    local_180 = (char *)bVar3.size_;
    local_188 = (v10 *)bVar3.data_;
    ::fmt::v10::detail::
    check_format_string<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_FMT_COMPILE_STRING,_0>
              ();
    local_198 = this;
    Message::GetToken(&local_1d0,local_110);
    utils::Hex_abi_cxx11_(&local_1b8,(utils *)&local_1d0,aBytes);
    local_1d2 = (undefined1  [2])Message::GetMessageId(local_110);
    local_68 = &local_178;
    local_78 = local_188;
    pcStack_70 = local_180;
    local_80 = (v10 *)&local_198;
    local_88 = &local_1b8;
    local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d2;
    local_50 = &local_78;
    local_a0 = local_188;
    local_98 = local_180;
    local_48 = local_a0;
    pcStack_40 = local_98;
    ::fmt::v10::
    make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,void*,std::__cxx11::string,unsigned_short>
              ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
                *)&this_local,local_80,(void **)local_88,local_90,(unsigned_short *)in_R8);
    local_30 = local_b0;
    in_R8 = &this_local;
    local_20 = 0x2de;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)in_R8;
    fmt.size_ = 0x2de;
    fmt.data_ = local_98;
    local_38 = in_R8;
    local_28 = in_R8;
    local_18 = local_30;
    local_10 = in_R8;
    ::fmt::v10::vformat_abi_cxx11_(&local_178,local_a0,fmt,args);
    Log(kInfo,&local_140,&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_1d0);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
  }
  return;
}

Assistant:

void Coap::ResponsesCache::Eliminate()
{
    auto now = Clock::now();

    while (!mContainer.empty())
    {
        auto  earliest = mContainer.begin();
        auto  deadTime = earliest->first;
        auto &response = earliest->second;
        if (deadTime > now)
        {
            break;
        }
        mContainer.erase(earliest);
        LOG_INFO(LOG_REGION_COAP, "server(={}) remove response cache: token={}, messageId={}",
                 static_cast<void *>(this), utils::Hex(response.GetToken()), response.GetMessageId());
    }
}